

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_handle_sRGB(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  ushort uVar1;
  int iVar2;
  undefined8 in_RAX;
  char *error_message;
  png_byte intent;
  
  intent = (png_byte)((ulong)in_RAX >> 0x38);
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 6) == 0) {
    if (length == 1) {
      png_crc_read(png_ptr,&intent,1);
      iVar2 = png_crc_finish(png_ptr,0);
      if ((iVar2 == 0) && (uVar1 = (png_ptr->colorspace).flags, -1 < (short)uVar1)) {
        if ((uVar1 & 4) == 0) {
          png_colorspace_set_sRGB(png_ptr,&png_ptr->colorspace,(uint)intent);
          png_colorspace_sync(png_ptr,info_ptr);
        }
        else {
          (png_ptr->colorspace).flags = uVar1 | 0x8000;
          png_colorspace_sync(png_ptr,info_ptr);
          png_chunk_benign_error(png_ptr,"too many profiles");
        }
      }
      return;
    }
    png_crc_finish(png_ptr,length);
    error_message = "invalid";
  }
  else {
    png_crc_finish(png_ptr,length);
    error_message = "out of place";
  }
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_sRGB(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte intent;

   png_debug(1, "in png_handle_sRGB");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & (PNG_HAVE_IDAT|PNG_HAVE_PLTE)) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   if (length != 1)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, &intent, 1);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* If a colorspace error has already been output skip this chunk */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_INVALID) != 0)
      return;

   /* Only one sRGB or iCCP chunk is allowed, use the HAVE_INTENT flag to detect
    * this.
    */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_INTENT) != 0)
   {
      png_ptr->colorspace.flags |= PNG_COLORSPACE_INVALID;
      png_colorspace_sync(png_ptr, info_ptr);
      png_chunk_benign_error(png_ptr, "too many profiles");
      return;
   }

   (void)png_colorspace_set_sRGB(png_ptr, &png_ptr->colorspace, intent);
   png_colorspace_sync(png_ptr, info_ptr);
}